

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream.cc
# Opt level: O2

bool __thiscall
google::protobuf::io::ZeroCopyInputStream::ReadCord(ZeroCopyInputStream *this,Cord *cord,int count)

{
  int iVar1;
  bool bVar2;
  int count_local;
  Cord *cord_local;
  int local_bc;
  CordBuffer cord_buffer;
  Span<const_char> local_a8;
  Span<char> out;
  void *buffer;
  CordBuffer local_78;
  CordBuffer local_68;
  anon_class_16_2_401397fb CopyBytes;
  anon_class_24_3_65f58981 AppendFullBuffer;
  
  if (count < 1) {
    bVar2 = true;
  }
  else {
    count_local = count;
    cord_local = cord;
    absl::lts_20240722::Cord::GetAppendBuffer((Cord *)&cord_buffer,(size_t)cord,(ulong)(uint)count);
    out = absl::lts_20240722::CordBuffer::available_up_to(&cord_buffer,(long)count_local);
    AppendFullBuffer.cord = &cord_local;
    CopyBytes.count = &count_local;
    CopyBytes.cord_buffer = &cord_buffer;
    AppendFullBuffer.cord_buffer = &cord_buffer;
    AppendFullBuffer.count = CopyBytes.count;
    do {
      iVar1 = (*this->_vptr_ZeroCopyInputStream[2])(this,&buffer,&local_bc);
      if ((char)iVar1 == '\0') {
        local_a8.ptr_ = (pointer)0x0;
        local_a8.len_ = 0;
LAB_0015ff69:
        local_68.rep_.field_0.long_rep.padding = cord_buffer.rep_.field_0.long_rep.padding;
        cord_buffer.rep_.field_0.short_rep.raw_size = '\x01';
        absl::lts_20240722::Cord::Append(cord_local,&local_68);
        absl::lts_20240722::CordBuffer::~CordBuffer(&local_68);
        bVar2 = false;
        goto LAB_0015ff91;
      }
      iVar1 = local_bc;
      if (count_local < local_bc) {
        (*this->_vptr_ZeroCopyInputStream[3])(this);
        iVar1 = count_local;
      }
      local_a8.len_ = (size_type)iVar1;
      local_a8.ptr_ = (pointer)buffer;
      bVar2 = iVar1 != 0;
      if (iVar1 == 0) goto LAB_0015ff69;
      if (out.len_ != 0) goto LAB_0015fef3;
      out = ReadCord::anon_class_24_3_65f58981::operator()(&AppendFullBuffer);
      while( true ) {
LAB_0015fef3:
        if (local_a8.len_ <= out.len_) break;
        ReadCord::anon_class_16_2_401397fb::operator()(&CopyBytes,&out,&local_a8,out.len_);
        out = ReadCord::anon_class_24_3_65f58981::operator()(&AppendFullBuffer);
      }
      ReadCord::anon_class_16_2_401397fb::operator()(&CopyBytes,&out,&local_a8,local_a8.len_);
    } while (0 < count_local);
    local_78.rep_.field_0.long_rep.padding = cord_buffer.rep_.field_0.long_rep.padding;
    cord_buffer.rep_.field_0.short_rep.raw_size = '\x01';
    absl::lts_20240722::Cord::Append(cord_local,&local_78);
    absl::lts_20240722::CordBuffer::~CordBuffer(&local_78);
LAB_0015ff91:
    absl::lts_20240722::CordBuffer::~CordBuffer(&cord_buffer);
  }
  return bVar2;
}

Assistant:

bool ZeroCopyInputStream::ReadCord(absl::Cord* cord, int count) {
  if (count <= 0) return true;

  absl::CordBuffer cord_buffer = cord->GetAppendBuffer(count);
  absl::Span<char> out = cord_buffer.available_up_to(count);

  auto FetchNextChunk = [&]() -> absl::Span<const char> {
    const void* buffer;
    int size;
    if (!Next(&buffer, &size)) return {};

    if (size > count) {
      BackUp(size - count);
      size = count;
    }
    return absl::MakeConstSpan(static_cast<const char*>(buffer), size);
  };

  auto AppendFullBuffer = [&]() -> absl::Span<char> {
    cord->Append(std::move(cord_buffer));
    cord_buffer = absl::CordBuffer::CreateWithDefaultLimit(count);
    return cord_buffer.available_up_to(count);
  };

  auto CopyBytes = [&](absl::Span<char>& dst, absl::Span<const char>& src,
                       size_t bytes) {
    memcpy(dst.data(), src.data(), bytes);
    dst.remove_prefix(bytes);
    src.remove_prefix(bytes);
    count -= bytes;
    cord_buffer.IncreaseLengthBy(bytes);
  };

  do {
    absl::Span<const char> in = FetchNextChunk();
    if (in.empty()) {
      // Append whatever we have pending so far.
      cord->Append(std::move(cord_buffer));
      return false;
    }

    if (out.empty()) out = AppendFullBuffer();

    while (in.size() > out.size()) {
      CopyBytes(out, in, out.size());
      out = AppendFullBuffer();
    }

    CopyBytes(out, in, in.size());
  } while (count > 0);

  cord->Append(std::move(cord_buffer));
  return true;
}